

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdata.cpp
# Opt level: O2

int32_t __thiscall
icu_63::CollationData::getEquivalentScripts
          (CollationData *this,int32_t script,int32_t *dest,int32_t capacity,UErrorCode *errorCode)

{
  uint16_t *puVar1;
  uint uVar2;
  long lVar3;
  int32_t iVar4;
  
  iVar4 = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar2 = getScriptIndex(this,script);
    if (uVar2 != 0) {
      if (script < 0x1000) {
        puVar1 = this->scriptsIndex;
        iVar4 = 0;
        for (lVar3 = 0; lVar3 < this->numScripts; lVar3 = lVar3 + 1) {
          if (uVar2 == puVar1[lVar3]) {
            if (iVar4 < capacity) {
              dest[iVar4] = (int32_t)lVar3;
            }
            iVar4 = iVar4 + 1;
          }
        }
        if (capacity < iVar4) {
          *errorCode = U_BUFFER_OVERFLOW_ERROR;
        }
      }
      else {
        if (capacity < 1) {
          *errorCode = U_BUFFER_OVERFLOW_ERROR;
        }
        else {
          *dest = script;
        }
        iVar4 = 1;
      }
    }
  }
  return iVar4;
}

Assistant:

int32_t
CollationData::getEquivalentScripts(int32_t script,
                                    int32_t dest[], int32_t capacity,
                                    UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return 0; }
    int32_t index = getScriptIndex(script);
    if(index == 0) { return 0; }
    if(script >= UCOL_REORDER_CODE_FIRST) {
        // Special groups have no aliases.
        if(capacity > 0) {
            dest[0] = script;
        } else {
            errorCode = U_BUFFER_OVERFLOW_ERROR;
        }
        return 1;
    }

    int32_t length = 0;
    for(int32_t i = 0; i < numScripts; ++i) {
        if(scriptsIndex[i] == index) {
            if(length < capacity) {
                dest[length] = i;
            }
            ++length;
        }
    }
    if(length > capacity) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
    }
    return length;
}